

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_new(ExecutionEngine *this)

{
  cp_info *constantPool_00;
  Value operand;
  bool bVar1;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar2;
  u1 *puVar3;
  cp_info *pcVar4;
  char *pcVar5;
  MethodArea *this_02;
  ClassRuntime *classRuntime_00;
  anon_union_8_10_52016fac_for_data aVar6;
  undefined4 uStack_e0;
  Value objectref;
  ClassRuntime *classRuntime;
  MethodArea *methodArea;
  string local_b8 [32];
  anon_union_8_10_52016fac_for_data local_98;
  Object *object;
  allocator local_79;
  string local_78 [8];
  string className;
  char cStack_50;
  CONSTANT_Class_info classInfo;
  cp_info classCP;
  uint16_t classIndex;
  u1 byte2;
  u1 byte1;
  u1 *code;
  cp_info *constantPool;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  ppcVar2 = Frame::getConstantPool(this_01);
  constantPool_00 = *ppcVar2;
  puVar3 = Frame::getCode(this_01,this_01->pc);
  classCP.info._14_2_ = CONCAT11(puVar3[1],puVar3[2]);
  pcVar4 = constantPool_00 + (int)(CONCAT22(0,classCP.info._14_2_) - 1);
  cStack_50 = (char)*(undefined8 *)pcVar4;
  if (cStack_50 == '\a') {
    classCP._0_2_ = (pcVar4->info).long_info.high_bytes;
    pcVar5 = getFormattedConstant(constantPool_00,classCP._0_2_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,pcVar5,&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"java/lang/String");
    if (bVar1) {
      aVar6.object = (Object *)operator_new(0x28);
      methodArea._6_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"",(allocator *)((long)&methodArea + 7));
      StringObject::StringObject((StringObject *)aVar6.object,(string *)local_b8);
      methodArea._6_1_ = 0;
      local_98.object = aVar6.object;
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&methodArea + 7));
    }
    else {
      this_02 = MethodArea::getInstance();
      classRuntime_00 = MethodArea::loadClassNamed(this_02,(string *)local_78);
      aVar6.object = (Object *)operator_new(0x40);
      ClassInstance::ClassInstance((ClassInstance *)aVar6.object,classRuntime_00);
      local_98.object = aVar6.object;
    }
    operand.type = 9;
    operand.printType = uStack_e0;
    operand.data.longValue = local_98.longValue;
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 3;
    std::__cxx11::string::~string(local_78);
    return;
  }
  __assert_fail("classCP.tag == CONSTANT_Class",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x10b6,"void ExecutionEngine::i_new()");
}

Assistant:

void ExecutionEngine::i_new() {
    VMStack &stackFrame = VMStack::getInstance();       
    Frame *topFrame = stackFrame.getTopFrame();     
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t classIndex = (byte1 << 8) | byte2;
    cp_info classCP = constantPool[classIndex-1];
    assert(classCP.tag == CONSTANT_Class);
    
    CONSTANT_Class_info classInfo = classCP.info.class_info; // Formata nome da classe
    string className = getFormattedConstant(constantPool, classInfo.name_index);

    Object *object;
    if (className == "java/lang/String") {
        object = new StringObject();
    } else {
        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        object = new ClassInstance(classRuntime); // Cria instancia da classe e coloca na heap
    }
    
    // Armazena referência na pilha
    Value objectref;
    objectref.data.object = object;
    objectref.type = ValueType::REFERENCE;
    topFrame->pushIntoOperandStack(objectref);
    
    topFrame->pc += 3;
}